

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O2

void __thiscall
duckdb::RangeInfoStruct<duckdb::TimestampRangeInfo,_true>::RangeInfoStruct
          (RangeInfoStruct<duckdb::TimestampRangeInfo,_true> *this,DataChunk *args_p)

{
  reference pvVar1;
  InternalException *this_00;
  DataChunk *pDVar2;
  long lVar3;
  UnifiedVectorFormat *this_01;
  allocator local_49;
  string local_48 [32];
  
  this->args = args_p;
  this_01 = (UnifiedVectorFormat *)&this->field_0x8;
  lVar3 = 0;
  do {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(this_01);
    lVar3 = lVar3 + -0x48;
    this_01 = this_01 + 0x48;
  } while (lVar3 != -0xd8);
  pDVar2 = this->args;
  lVar3 = ((long)*(pointer *)&pDVar2[8].field_0x0 -
          (long)(((vector<duckdb::Vector,_std::allocator<duckdb::Vector>_> *)&pDVar2->field_0x0)->
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>)._M_impl.
                super__Vector_impl_data._M_start) / 0x68;
  if (lVar3 == 1) {
    pvVar1 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)pDVar2,0);
    pDVar2 = this->args + 0x18;
  }
  else if (lVar3 == 2) {
    pvVar1 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)pDVar2,0);
    duckdb::Vector::ToUnifiedFormat((ulong)pvVar1,*(UnifiedVectorFormat **)(this->args + 0x18));
    pvVar1 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this->args,1);
    pDVar2 = this->args + 0x18;
  }
  else {
    if (lVar3 != 3) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string(local_48,"Unsupported number of parameters for range",&local_49);
      duckdb::InternalException::InternalException(this_00,local_48);
      __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar1 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)pDVar2,0);
    duckdb::Vector::ToUnifiedFormat((ulong)pvVar1,*(UnifiedVectorFormat **)(this->args + 0x18));
    pvVar1 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this->args,1);
    duckdb::Vector::ToUnifiedFormat((ulong)pvVar1,*(UnifiedVectorFormat **)(this->args + 0x18));
    pvVar1 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this->args,2);
    pDVar2 = this->args + 0x18;
  }
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar1,*(UnifiedVectorFormat **)pDVar2);
  return;
}

Assistant:

explicit RangeInfoStruct(DataChunk &args_p) : args(args_p) {
		switch (args.ColumnCount()) {
		case 1:
			args.data[0].ToUnifiedFormat(args.size(), vdata[0]);
			break;
		case 2:
			args.data[0].ToUnifiedFormat(args.size(), vdata[0]);
			args.data[1].ToUnifiedFormat(args.size(), vdata[1]);
			break;
		case 3:
			args.data[0].ToUnifiedFormat(args.size(), vdata[0]);
			args.data[1].ToUnifiedFormat(args.size(), vdata[1]);
			args.data[2].ToUnifiedFormat(args.size(), vdata[2]);
			break;
		default:
			throw InternalException("Unsupported number of parameters for range");
		}
	}